

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

void UnlockDirectory(path *directory,path *lockfile_name)

{
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock1;
  path local_88;
  path local_60;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            (&criticalblock1,&cs_dir_locks,"cs_dir_locks",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/fs_helpers.cpp"
             ,0x53,false);
  std::filesystem::__cxx11::path::path(&local_88,&directory->super_path);
  fs::operator/((path *)&local_60,(path *)&local_88,lockfile_name);
  std::filesystem::__cxx11::path::string(&local_38,&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>_>
  ::erase(&dir_locks_abi_cxx11_._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnlockDirectory(const fs::path& directory, const fs::path& lockfile_name)
{
    LOCK(cs_dir_locks);
    dir_locks.erase(fs::PathToString(directory / lockfile_name));
}